

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void kj::(anonymous_namespace)::expectRes<kj::Array<unsigned_char>,4ul>
               (EncodingResult<kj::Array<unsigned_char>_> *result,byte (*expected) [4],bool errors)

{
  ArrayDisposer *pAVar1;
  int iVar2;
  undefined7 in_register_00000011;
  bool *pbVar3;
  bool *pbVar4;
  CappedArray<char,_3UL> CVar5;
  uchar *puVar6;
  bool *pbVar7;
  bool local_90 [16];
  DebugExpression<const_bool_&> _kjCondition;
  unsigned_long i;
  CappedArray<char,_3UL> local_50;
  CappedArray<char,_3UL> local_40;
  
  puVar6 = (result->super_Array<unsigned_char>).ptr;
  pbVar7 = (bool *)(result->super_Array<unsigned_char>).size_;
  pAVar1 = (result->super_Array<unsigned_char>).disposer;
  (result->super_Array<unsigned_char>).ptr = (uchar *)0x0;
  (result->super_Array<unsigned_char>).size_ = 0;
  local_90[0] = result->hadErrors;
  if ((int)CONCAT71(in_register_00000011,errors) == 0) {
    _kjCondition.value = (bool *)(CONCAT71(_kjCondition.value._1_7_,local_90[0]) ^ 1);
    if ((local_90[0] != false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x31,ERROR,"\"failed: expected \" \"!result.hadErrors\", _kjCondition",
                 (char (*) [35])"failed: expected !result.hadErrors",
                 (DebugExpression<bool> *)&_kjCondition);
    }
  }
  else {
    _kjCondition.value = local_90;
    if ((local_90[0] == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2f,ERROR,"\"failed: expected \" \"result.hadErrors\", _kjCondition",
                 (char (*) [34])"failed: expected result.hadErrors",&_kjCondition);
    }
  }
  _kjCondition.value = pbVar7;
  if ((pbVar7 != (bool *)&DAT_00000004) && (kj::_::Debug::minSeverity < 3)) {
    local_50.currentSize = 4;
    local_40.currentSize = (size_t)pbVar7;
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x34,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", _kjCondition, result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,&local_40.currentSize,
               &local_50.currentSize);
  }
  pbVar3 = (bool *)&DAT_00000004;
  if (pbVar7 < &DAT_00000004) {
    pbVar3 = pbVar7;
  }
  if (pbVar7 != (bool *)0x0) {
    pbVar4 = (bool *)0x0;
    iVar2 = kj::_::Debug::minSeverity;
    do {
      _kjCondition.value = pbVar4 + (long)puVar6;
      i = (unsigned_long)pbVar4;
      if ((pbVar4[(long)puVar6] != pbVar4[(long)*expected]) && (iVar2 < 3)) {
        CVar5 = hex(*_kjCondition.value);
        local_40.currentSize = CVar5.currentSize;
        local_40.content._0_2_ = CVar5.content._0_2_;
        local_40.content[2] = CVar5.content[2];
        CVar5 = hex((*expected)[i]);
        local_50.currentSize = CVar5.currentSize;
        local_50.content._0_2_ = CVar5.content._0_2_;
        local_50.content[2] = CVar5.content[2];
        kj::_::Debug::
        log<char_const(&)[42],kj::_::DebugComparison<unsigned_char&,unsigned_char_const&>&,unsigned_long&,kj::CappedArray<char,3ul>,kj::CappedArray<char,3ul>>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                   ,0x36,ERROR,
                   "\"failed: expected \" \"result[i] == expected[i]\", _kjCondition, i, hex(result[i]), hex(expected[i])"
                   ,(char (*) [42])"failed: expected result[i] == expected[i]",
                   (DebugComparison<unsigned_char_&,_const_unsigned_char_&> *)&_kjCondition,&i,
                   &local_40,&local_50);
        iVar2 = kj::_::Debug::minSeverity;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar3 != pbVar4);
  }
  if (puVar6 != (uchar *)0x0) {
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,puVar6,1,pbVar7,pbVar7,0,0,0);
  }
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               byte (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr<const byte>(expected, s), errors);
}